

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reg.c
# Opt level: O2

reg_t * reg_acquire(reg_purpose_t purpose,int type,int ver)

{
  reg_t *prVar1;
  reg_purpose_t rVar2;
  reg_t *table;
  
  if (ver - 2U < 7) {
    table = (reg_t *)(&PTR_regs_v2_v3_v4_v7_v8_0014dc00)[ver - 2U];
  }
  else {
    table = (reg_t *)0x0;
  }
  prVar1 = reg_acquire_purpose(purpose,type,table);
  if (prVar1 == (reg_t *)0x0) {
    rVar2 = PURPOSE_VAR;
    if (purpose == PURPOSE_EXPR) {
LAB_0010e8a2:
      prVar1 = reg_acquire_purpose(rVar2,type,table);
      if (prVar1 != (reg_t *)0x0) goto LAB_0010e87e;
    }
    else if (purpose == PURPOSE_VAR) {
      rVar2 = PURPOSE_EXPR;
      goto LAB_0010e8a2;
    }
    prVar1 = (reg_t *)0x0;
  }
  else {
LAB_0010e87e:
    rVar2 = purpose == PURPOSE_VAR ^ (PURPOSE_OTHER|PURPOSE_VAR);
    if (purpose == PURPOSE_EXPR) {
      rVar2 = PURPOSE_VAR;
    }
    prVar1->lock = rVar2;
  }
  return prVar1;
}

Assistant:

reg_t*
reg_acquire(
   reg_purpose_t purpose,
   int type,
   int ver
) {
    reg_t* table = reg_get_table(ver);
    reg_t* ret = reg_acquire_purpose(purpose, type, table);
    if (ret == NULL) {
        /* Try to use a register that's usually for other things. */
        if (purpose == PURPOSE_EXPR)
            ret = reg_acquire_purpose(PURPOSE_VAR, type, table);
        else if (purpose == PURPOSE_VAR)
            ret = reg_acquire_purpose(PURPOSE_EXPR, type, table);
    }

    if (ret) {
        if (purpose == PURPOSE_EXPR)
            ret->lock = LOCK_EXPR;
        else if (purpose == PURPOSE_VAR)
            ret->lock = LOCK_VAR;
        else
            ret->lock = LOCK_OTHER;
    }

    return ret;
}